

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O2

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  long lVar1;
  char *pcVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  Iterator *pIVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *__tmp;
  char *pcVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  Status local_88;
  Slice local_80;
  Slice key;
  WritableFile *file;
  string fname;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  meta->file_size = 0;
  (*iter->_vptr_Iterator[3])(iter);
  TableFileName(&fname,dbname,meta->number);
  iVar3 = (*iter->_vptr_Iterator[2])(iter);
  if ((char)iVar3 == '\0') {
    pcVar6 = (char *)0x0;
  }
  else {
    (*env->_vptr_Env[4])(&key,env,&fname,&file);
    pcVar6 = key.data_;
    *(char **)this = key.data_;
    key.data_ = (char *)0x0;
    Status::~Status((Status *)&key);
    if (pcVar6 != (char *)0x0) goto LAB_00a4c8a6;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,file);
    iVar3 = (*iter->_vptr_Iterator[8])(iter);
    key.data_ = (char *)CONCAT44(extraout_var,iVar3);
    key.size_ = extraout_RDX;
    InternalKey::DecodeFrom(&meta->smallest,&key);
    while (iVar3 = (*iter->_vptr_Iterator[2])(iter), (char)iVar3 != '\0') {
      iVar3 = (*iter->_vptr_Iterator[8])(iter);
      key.data_ = (char *)CONCAT44(extraout_var_00,iVar3);
      key.size_ = extraout_RDX_00;
      InternalKey::DecodeFrom(&meta->largest,&key);
      iVar3 = (*iter->_vptr_Iterator[9])(iter);
      local_80.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      TableBuilder::Add(this_00,&key,&local_80);
      (*iter->_vptr_Iterator[6])(iter);
    }
    TableBuilder::Finish((TableBuilder *)&key);
    pcVar6 = key.data_;
    *(char **)this = key.data_;
    key.data_ = (char *)0x0;
    Status::~Status((Status *)&key);
    if (pcVar6 == (char *)0x0) {
      uVar4 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar4;
      if (uVar4 == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
      (*file->_vptr_WritableFile[5])(&key);
      pcVar6 = key.data_;
      *(char **)this = key.data_;
      key.data_ = (char *)0x0;
      Status::~Status((Status *)&key);
      if (pcVar6 == (char *)0x0) {
        (*file->_vptr_WritableFile[3])(&key);
        pcVar6 = key.data_;
        *(char **)this = key.data_;
        key.data_ = (char *)0x0;
        Status::~Status((Status *)&key);
      }
    }
    else {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00,8);
    }
    if (file != (WritableFile *)0x0) {
      (*file->_vptr_WritableFile[1])();
    }
    file = (WritableFile *)0x0;
    if (pcVar6 == (char *)0x0) {
      key.size_ = 0;
      key.data_ = (char *)0x100;
      pIVar5 = TableCache::NewIterator
                         (table_cache,(ReadOptions *)&key,meta->number,meta->file_size,(Table **)0x0
                         );
      (*pIVar5->_vptr_Iterator[10])(&key,pIVar5);
      pcVar6 = key.data_;
      *(char **)this = key.data_;
      key.data_ = (char *)0x0;
      Status::~Status((Status *)&key);
      (*pIVar5->_vptr_Iterator[1])(pIVar5);
    }
  }
  (*iter->_vptr_Iterator[10])(&key,iter);
  pcVar2 = key.data_;
  Status::~Status((Status *)&key);
  pcVar7 = pcVar6;
  if (pcVar2 != (char *)0x0) {
    (*iter->_vptr_Iterator[10])(&key,iter);
    pcVar7 = key.data_;
    *(char **)this = key.data_;
    key.data_ = pcVar6;
    Status::~Status((Status *)&key);
  }
  if ((pcVar7 != (char *)0x0) || (meta->file_size == 0)) {
    (*env->_vptr_Env[8])(&local_88,env,&fname);
    Status::~Status(&local_88);
  }
LAB_00a4c8a6:
  std::__cxx11::string::~string((string *)&fname);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->DeleteFile(fname);
  }
  return s;
}